

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O1

Result * validateUpdatableNeuralNetwork<CoreML::Specification::NeuralNetworkRegressor>
                   (Result *__return_storage_ptr__,NeuralNetworkRegressor *nn)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  pointer ppLVar4;
  LayerNode *pLVar5;
  bool bVar6;
  bool bVar7;
  Type *pTVar8;
  const_iterator cVar9;
  long *plVar10;
  Type *pTVar11;
  NetworkUpdateParameters *pNVar12;
  iterator iVar13;
  LayerNode *extraout_RAX;
  LayerNode *pLVar14;
  ulong *puVar15;
  size_type *psVar16;
  long *plVar17;
  int index;
  int iVar18;
  Optimizer *optimizer;
  bool bVar19;
  pointer ppLVar20;
  string err_1;
  string layerName;
  string firstNonBackpropogabaleLayerSeen;
  string lossLayerName_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  visitedLayersSet;
  Result r;
  string err_4;
  string err_3;
  string err;
  string currentNodeName;
  vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> layerNodes;
  undefined1 local_2d8 [8];
  _Alloc_hider local_2d0;
  undefined1 local_2c8 [24];
  undefined1 local_2b0 [8];
  _Alloc_hider local_2a8;
  undefined1 local_2a0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  value_type local_268;
  undefined1 local_248 [8];
  undefined1 local_240 [32];
  size_t local_220;
  LayerNode *local_218;
  RepeatedPtrFieldBase *local_210;
  undefined1 local_208 [8];
  undefined1 auStack_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1f0;
  pointer ppLStack_1e0;
  _Base_ptr local_1d8;
  _Alloc_hider _Stack_1d0;
  _Elt_pointer local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  string local_178;
  int local_154;
  key_type local_150;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  undefined1 local_120 [24];
  size_t local_108;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
  local_100;
  string *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> local_a8;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CoreML::Result::Result(__return_storage_ptr__);
  CoreML::Result::Result((Result *)local_208);
  index = 0;
  iVar18 = (nn->layers_).super_RepeatedPtrFieldBase.current_size_;
  bVar7 = 0 < iVar18;
  if (iVar18 < 1) {
    bVar19 = false;
  }
  else {
    bVar7 = true;
    bVar19 = false;
    do {
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&(nn->layers_).super_RepeatedPtrFieldBase,index);
      bVar6 = true;
      if (pTVar8->isupdatable_ == true) {
        if ((pTVar8->_oneof_case_[0] == 100) || (pTVar8->_oneof_case_[0] == 0x8c)) {
          validateWeightParamsUpdatable((Result *)local_130,pTVar8);
          local_208 = local_130;
          std::__cxx11::string::operator=((string *)auStack_200,(string *)&local_128);
          if (local_128._M_p != local_120 + 8) {
            operator_delete(local_128._M_p,(ulong)(local_120._8_8_ + 1));
          }
          bVar6 = CoreML::Result::good((Result *)local_208);
          bVar19 = true;
          if (bVar6) {
            bVar6 = true;
            goto LAB_00299bf2;
          }
          local_248 = local_208;
          local_240._0_8_ = local_240 + 0x10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)auStack_200._0_8_ == &aStack_1f0) {
            local_240._24_8_ = aStack_1f0._8_8_;
          }
          else {
            local_240._0_8_ = auStack_200._0_8_;
          }
          local_240._16_8_ = aStack_1f0._M_allocated_capacity;
          local_240._8_8_ = auStack_200._8_8_;
          auStack_200._8_8_ = (_Base_ptr)0x0;
          aStack_1f0._M_allocated_capacity = aStack_1f0._M_allocated_capacity & 0xffffffffffffff00;
          auStack_200._0_8_ = &aStack_1f0;
        }
        else {
          local_130 = (undefined1  [8])local_120;
          local_128._M_p = (pointer)0x0;
          local_120._0_8_ = local_120._0_8_ & 0xffffffffffffff00;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b0,"The layer named \'",(pTVar8->name_).ptr_);
          plVar10 = (long *)std::__cxx11::string::append((char *)local_2b0);
          puVar15 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar15) {
            local_2c8._0_8_ = *puVar15;
            local_2c8._8_8_ = plVar10[3];
            local_2d8 = (undefined1  [8])local_2c8;
          }
          else {
            local_2c8._0_8_ = *puVar15;
            local_2d8 = (undefined1  [8])*plVar10;
          }
          local_2d0._M_p = (pointer)plVar10[1];
          *plVar10 = (long)puVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_130,(string *)local_2d8);
          if (local_2d8 != (undefined1  [8])local_2c8) {
            operator_delete((void *)local_2d8,(ulong)(local_2c8._0_8_ + 1));
          }
          if (local_2b0 != (undefined1  [8])local_2a0) {
            operator_delete((void *)local_2b0,local_2a0._0_8_ + 1);
          }
          CoreML::Result::Result
                    ((Result *)local_248,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_130);
          if (local_130 != (undefined1  [8])local_120) {
            operator_delete((void *)local_130,(ulong)(local_120._0_8_ + 1));
          }
        }
        bVar19 = true;
        bVar6 = false;
      }
LAB_00299bf2:
      if (!bVar6) break;
      index = index + 1;
      iVar18 = (nn->layers_).super_RepeatedPtrFieldBase.current_size_;
      bVar7 = index < iVar18;
    } while (index < iVar18);
  }
  if (!bVar7) {
    if (bVar19) {
      local_240._0_8_ = local_240 + 0x10;
      local_248 = local_208;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_200._0_8_ == &aStack_1f0) {
        local_240._24_8_ = aStack_1f0._8_8_;
      }
      else {
        local_240._0_8_ = auStack_200._0_8_;
      }
      local_240._16_8_ = aStack_1f0._M_allocated_capacity;
      local_240._8_8_ = auStack_200._8_8_;
      auStack_200._8_8_ = (_Base_ptr)0x0;
      aStack_1f0._M_allocated_capacity = aStack_1f0._M_allocated_capacity & 0xffffffffffffff00;
      auStack_200._0_8_ = &aStack_1f0;
    }
    else {
      local_128._M_p = (pointer)0x0;
      local_120._0_8_ = local_120._0_8_ & 0xffffffffffffff00;
      local_130 = (undefined1  [8])local_120;
      std::__cxx11::string::_M_replace((ulong)local_130,0,(char *)0x0,0x322e36);
      CoreML::Result::Result
                ((Result *)local_248,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_130);
      if (local_130 != (undefined1  [8])local_120) {
        operator_delete((void *)local_130,(ulong)(local_120._0_8_ + 1));
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_200._0_8_ != &aStack_1f0) {
    operator_delete((void *)auStack_200._0_8_,(ulong)(aStack_1f0._M_allocated_capacity + 1));
  }
  __return_storage_ptr__->m_type = local_248._0_4_;
  __return_storage_ptr__->m_reason = local_248._4_4_;
  local_d0 = (string *)&__return_storage_ptr__->m_message;
  std::__cxx11::string::operator=(local_d0,(string *)local_240);
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
  }
  bVar7 = CoreML::Result::good(__return_storage_ptr__);
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  CoreML::Result::Result((Result *)local_130);
  aStack_1f0._M_allocated_capacity = (size_type)auStack_200;
  auStack_200._0_8_ = auStack_200._0_8_ & 0xffffffff00000000;
  iVar18 = 0;
  auStack_200._8_8_ = (_Base_ptr)0x0;
  ppLStack_1e0 = (pointer)0x0;
  local_2d8 = (undefined1  [8])local_2c8;
  local_2d0._M_p = (pointer)0x0;
  local_2c8._0_8_ = local_2c8._0_8_ & 0xffffffffffffff00;
  aStack_1f0._8_8_ = aStack_1f0._M_allocated_capacity;
  if (0 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_) {
    do {
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&(nn->layers_).super_RepeatedPtrFieldBase,iVar18);
      psVar2 = (pTVar8->name_).ptr_;
      local_2b0 = (undefined1  [8])local_2a0;
      pcVar3 = (psVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2b0,pcVar3,pcVar3 + psVar2->_M_string_length);
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_208,(key_type *)local_2b0);
      if (cVar9._M_node == (_Base_ptr)auStack_200) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_208,(key_type *)local_2b0);
      }
      else {
        std::operator+(&local_288,"The updatable model has a name collision for: \'",
                       (key_type *)local_2b0);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_288);
        psVar16 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_268.field_2._M_allocated_capacity = *psVar16;
          local_268.field_2._8_8_ = plVar10[3];
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar16;
          local_268._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_268._M_string_length = plVar10[1];
        *plVar10 = (long)psVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_2d8,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        CoreML::Result::Result
                  ((Result *)local_248,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_2d8);
      }
      if (local_2b0 != (undefined1  [8])local_2a0) {
        operator_delete((void *)local_2b0,local_2a0._0_8_ + 1);
      }
      if (cVar9._M_node != (_Base_ptr)auStack_200) goto LAB_0029a195;
      iVar18 = iVar18 + 1;
    } while (iVar18 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_);
  }
  local_218 = (LayerNode *)nn->updateparams_;
  if (local_218 == (LayerNode *)0x0) {
    local_218 = (LayerNode *)&CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  if (0 < *(int *)&(local_218->children).
                   super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    local_210 = (RepeatedPtrFieldBase *)
                &(local_218->parents).
                 super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar18 = 0;
    do {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                          (local_210,iVar18);
      psVar2 = (pTVar11->name_).ptr_;
      local_2b0 = (undefined1  [8])local_2a0;
      pcVar3 = (psVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2b0,pcVar3,pcVar3 + psVar2->_M_string_length);
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_208,(key_type *)local_2b0);
      if (cVar9._M_node == (_Base_ptr)auStack_200) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_208,(key_type *)local_2b0);
      }
      else {
        std::operator+(&local_288,"The updatable model has a name collision for: \'",
                       (key_type *)local_2b0);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_288);
        psVar16 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_268.field_2._M_allocated_capacity = *psVar16;
          local_268.field_2._8_8_ = plVar10[3];
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar16;
          local_268._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_268._M_string_length = plVar10[1];
        *plVar10 = (long)psVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_2d8,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        CoreML::Result::Result
                  ((Result *)local_248,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_2d8);
      }
      if (local_2b0 != (undefined1  [8])local_2a0) {
        operator_delete((void *)local_2b0,local_2a0._0_8_ + 1);
      }
      if (cVar9._M_node != (_Base_ptr)auStack_200) goto LAB_0029a195;
      iVar18 = iVar18 + 1;
    } while (iVar18 < *(int *)&(local_218->children).
                               super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_248 = local_130;
  local_240._0_8_ = local_240 + 0x10;
  if (local_128._M_p == local_120 + 8) {
    local_240._24_8_ = local_120._16_8_;
  }
  else {
    local_240._0_8_ = local_128._M_p;
  }
  local_240._16_8_ = local_120._8_8_;
  local_240._8_8_ = local_120._0_8_;
  local_120._0_8_ = (pointer)0x0;
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_128._M_p = local_120 + 8;
LAB_0029a195:
  if (local_2d8 != (undefined1  [8])local_2c8) {
    operator_delete((void *)local_2d8,(ulong)(local_2c8._0_8_ + 1));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208);
  if (local_128._M_p != local_120 + 8) {
    operator_delete(local_128._M_p,(ulong)(local_120._8_8_ + 1));
  }
  __return_storage_ptr__->m_type = local_248._0_4_;
  __return_storage_ptr__->m_reason = local_248._4_4_;
  std::__cxx11::string::operator=(local_d0,(string *)local_240);
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
  }
  bVar7 = CoreML::Result::good(__return_storage_ptr__);
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  CoreML::Result::Result((Result *)local_2d8);
  pNVar12 = nn->updateparams_;
  if (pNVar12 == (NetworkUpdateParameters *)0x0) {
    pNVar12 = (NetworkUpdateParameters *)
              &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  if (1 < (pNVar12->losslayers_).super_RepeatedPtrFieldBase.current_size_) {
    auStack_200._0_8_ = (pointer)0x0;
    auStack_200._8_8_ = auStack_200._8_8_ & 0xffffffffffffff00;
    local_208 = (undefined1  [8])(auStack_200 + 8);
    std::__cxx11::string::_M_replace((ulong)local_208,0,(char *)0x0,0x322fa4);
    CoreML::Result::Result
              ((Result *)local_2b0,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_208);
    if (local_208 != (undefined1  [8])(auStack_200 + 8)) {
      operator_delete((void *)local_208,(ulong)(auStack_200._8_8_ + 1));
    }
    goto LAB_0029ad06;
  }
  local_120._8_8_ = &local_128;
  local_128._M_p = local_128._M_p & 0xffffffff00000000;
  local_120._0_8_ = (pointer)0x0;
  local_108 = 0;
  local_100._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_100._M_impl.super__Rb_tree_header._M_header;
  local_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_100._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120._16_8_ = local_120._8_8_;
  local_100._M_impl.super__Rb_tree_header._M_header._M_right =
       local_100._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::resize
            (&local_a8,
             (long)(pNVar12->losslayers_).super_RepeatedPtrFieldBase.current_size_ +
             (long)(nn->layers_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_) {
    iVar18 = 0;
    do {
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&(nn->layers_).super_RepeatedPtrFieldBase,iVar18);
      CoreML::LayerNode::LayerNode((LayerNode *)local_208,pTVar8);
      std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::
      emplace_back<CoreML::LayerNode>(&local_a8,(LayerNode *)local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_198);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_1d0._M_p != &aStack_1c0) {
        operator_delete(_Stack_1d0._M_p,aStack_1c0._M_allocated_capacity + 1);
      }
      if ((_Alloc_hider *)aStack_1f0._M_allocated_capacity != (_Alloc_hider *)0x0) {
        operator_delete((void *)aStack_1f0._M_allocated_capacity,
                        (long)ppLStack_1e0 - aStack_1f0._0_8_);
      }
      if (local_208 != (undefined1  [8])0x0) {
        operator_delete((void *)local_208,auStack_200._8_8_ - (long)local_208);
      }
      CoreML::NeuralNetworkValidatorGraph::insertNode
                ((NeuralNetworkValidatorGraph *)local_130,
                 local_a8.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1);
      iVar18 = iVar18 + 1;
    } while (iVar18 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_);
  }
  pNVar12 = nn->updateparams_;
  if (pNVar12 == (NetworkUpdateParameters *)0x0) {
    pNVar12 = (NetworkUpdateParameters *)
              &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  if (0 < (pNVar12->losslayers_).super_RepeatedPtrFieldBase.current_size_) {
    iVar18 = 0;
    do {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                          (&(pNVar12->losslayers_).super_RepeatedPtrFieldBase,iVar18);
      CoreML::LayerNode::LayerNode((LayerNode *)local_208,pTVar11);
      std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::
      emplace_back<CoreML::LayerNode>(&local_a8,(LayerNode *)local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_198);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_1d0._M_p != &aStack_1c0) {
        operator_delete(_Stack_1d0._M_p,aStack_1c0._M_allocated_capacity + 1);
      }
      if ((_Alloc_hider *)aStack_1f0._M_allocated_capacity != (_Alloc_hider *)0x0) {
        operator_delete((void *)aStack_1f0._M_allocated_capacity,
                        (long)ppLStack_1e0 - aStack_1f0._0_8_);
      }
      if (local_208 != (undefined1  [8])0x0) {
        operator_delete((void *)local_208,auStack_200._8_8_ - (long)local_208);
      }
      CoreML::NeuralNetworkValidatorGraph::insertNode
                ((NeuralNetworkValidatorGraph *)local_130,
                 local_a8.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1);
      validateLossLayer((Result *)local_208,pTVar11,(NeuralNetworkValidatorGraph *)local_130);
      local_2d8 = local_208;
      std::__cxx11::string::operator=((string *)&local_2d0,(string *)auStack_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_200._0_8_ != &aStack_1f0) {
        operator_delete((void *)auStack_200._0_8_,(ulong)(aStack_1f0._M_allocated_capacity + 1));
      }
      bVar7 = CoreML::Result::good((Result *)local_2d8);
      if (!bVar7) goto LAB_0029ac8c;
      pNVar12 = nn->updateparams_;
      if (pNVar12 == (NetworkUpdateParameters *)0x0) {
        pNVar12 = (NetworkUpdateParameters *)
                  &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 < (pNVar12->losslayers_).super_RepeatedPtrFieldBase.current_size_);
  }
  pNVar12 = nn->updateparams_;
  if (pNVar12 == (NetworkUpdateParameters *)0x0) {
    pNVar12 = (NetworkUpdateParameters *)
              &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  optimizer = pNVar12->optimizer_;
  if (optimizer == (Optimizer *)0x0) {
    optimizer = (Optimizer *)&CoreML::Specification::_Optimizer_default_instance_;
  }
  validateOptimizer((Result *)local_208,optimizer);
  local_2d8 = local_208;
  std::__cxx11::string::operator=((string *)&local_2d0,(string *)auStack_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_200._0_8_ != &aStack_1f0) {
    operator_delete((void *)auStack_200._0_8_,(ulong)(aStack_1f0._M_allocated_capacity + 1));
  }
  bVar7 = CoreML::Result::good((Result *)local_2d8);
  if (bVar7) {
    pNVar12 = nn->updateparams_;
    if (pNVar12 == (NetworkUpdateParameters *)0x0) {
      pNVar12 = (NetworkUpdateParameters *)
                &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    validateOtherTopLevelUpdateParameters((Result *)local_208,pNVar12);
    local_2d8 = local_208;
    std::__cxx11::string::operator=((string *)&local_2d0,(string *)auStack_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_200._0_8_ != &aStack_1f0) {
      operator_delete((void *)auStack_200._0_8_,(ulong)(aStack_1f0._M_allocated_capacity + 1));
    }
    bVar7 = CoreML::Result::good((Result *)local_2d8);
    if (!bVar7) goto LAB_0029ac8c;
    local_240._0_8_ = local_240._0_8_ & 0xffffffff00000000;
    local_240._8_8_ = (_Base_ptr)0x0;
    local_240._16_8_ = local_240;
    local_220 = 0;
    pNVar12 = nn->updateparams_;
    if (pNVar12 == (NetworkUpdateParameters *)0x0) {
      pNVar12 = (NetworkUpdateParameters *)
                &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    local_240._24_8_ = local_240._16_8_;
    if ((pNVar12->losslayers_).super_RepeatedPtrFieldBase.current_size_ < 1) {
LAB_0029ac55:
      local_2a8._M_p = local_2a0 + 8;
      local_2b0 = local_2d8;
      if (local_2d0._M_p == local_2c8 + 8) {
        local_2a0._16_8_ = local_2c8._16_8_;
      }
      else {
        local_2a8._M_p = local_2d0._M_p;
      }
      local_2a0._8_8_ = local_2c8._8_8_;
      local_2a0._0_8_ = local_2c8._0_8_;
      local_2c8._0_8_ = (pointer)0x0;
      local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffffffffff00;
      local_2d0._M_p = local_2c8 + 8;
    }
    else {
      paVar1 = &local_150.field_2;
      iVar18 = 0;
      do {
        local_154 = iVar18;
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                            (&(pNVar12->losslayers_).super_RepeatedPtrFieldBase,iVar18);
        psVar2 = (pTVar11->name_).ptr_;
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        pcVar3 = (psVar2->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_268,pcVar3,pcVar3 + psVar2->_M_string_length);
        local_1c8 = (_Elt_pointer)0x0;
        aStack_1c0._M_allocated_capacity = 0;
        local_1d8 = (_Base_ptr)0x0;
        _Stack_1d0._M_p = (pointer)0x0;
        aStack_1f0._8_8_ = (_Alloc_hider *)0x0;
        ppLStack_1e0 = (pointer)0x0;
        auStack_200._8_8_ = (_Base_ptr)0x0;
        aStack_1f0._M_allocated_capacity = 0;
        local_208 = (undefined1  [8])0x0;
        auStack_200._0_8_ = (pointer)0x0;
        std::
        _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_208,0);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_208,&local_268);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        local_288._M_string_length = 0;
        local_288.field_2._M_local_buf[0] = '\0';
        local_210 = (RepeatedPtrFieldBase *)((ulong)local_210 & 0xffffffff00000000);
        do {
          if (local_1d8 == (_Base_ptr)auStack_200._8_8_) {
            iVar18 = 0;
            break;
          }
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,*(long *)auStack_200._8_8_,
                     (long)&(*(_Base_ptr *)(auStack_200._8_8_ + 8))->_M_color +
                     *(long *)auStack_200._8_8_);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_208);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,local_c8._M_dataplus._M_p,
                     local_c8._M_dataplus._M_p + local_c8._M_string_length);
          local_218 = CoreML::NeuralNetworkValidatorGraph::getNodeFromName
                                ((NeuralNetworkValidatorGraph *)local_130,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if (local_218 == (LayerNode *)0x0) {
            std::operator+(&local_178,"Failed to look up node for \'",&local_c8);
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_178);
            psVar16 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_150.field_2._M_allocated_capacity = *psVar16;
              local_150.field_2._8_8_ = plVar10[3];
              local_150._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_150.field_2._M_allocated_capacity = *psVar16;
              local_150._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_150._M_string_length = plVar10[1];
            *plVar10 = (long)psVar16;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,
                              CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                       local_178.field_2._M_local_buf[0]) + 1);
            }
            CoreML::Result::Result
                      ((Result *)local_2b0,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_150);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != paVar1) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            iVar18 = 1;
          }
          else {
            ppLVar20 = (local_218->parents).
                       super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppLVar4 = (local_218->parents).
                      super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            iVar18 = 0xd;
            if (ppLVar20 != ppLVar4) {
              do {
                pLVar5 = *ppLVar20;
                pcVar3 = (pLVar5->name)._M_dataplus._M_p;
                local_150._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_150,pcVar3,pcVar3 + (pLVar5->name)._M_string_length);
                iVar13 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_248,&local_150);
                iVar18 = 0xe;
                if (iVar13._M_node == (_Base_ptr)local_240) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_248,&local_150);
                  std::
                  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_208,&local_150);
                  if ((pLVar5->isUpdatable == true) && (((ulong)local_210 & 1) != 0)) {
                    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
                    local_178._M_string_length = 0;
                    local_178.field_2._M_local_buf[0] = '\0';
                    std::operator+(&local_50,"There is a layer (",&local_288);
                    plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
                    plVar17 = plVar10 + 2;
                    if ((long *)*plVar10 == plVar17) {
                      local_80 = *plVar17;
                      lStack_78 = plVar10[3];
                      local_90 = &local_80;
                    }
                    else {
                      local_80 = *plVar17;
                      local_90 = (long *)*plVar10;
                    }
                    local_88 = plVar10[1];
                    *plVar10 = (long)plVar17;
                    plVar10[1] = 0;
                    *(undefined1 *)(plVar10 + 2) = 0;
                    std::__cxx11::string::operator=((string *)&local_178,(string *)&local_90);
                    if (local_90 != &local_80) {
                      operator_delete(local_90,local_80 + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p,
                                      local_50.field_2._M_allocated_capacity + 1);
                    }
                    CoreML::Result::Result
                              ((Result *)local_2b0,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_178)
                    ;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_178._M_dataplus._M_p != &local_178.field_2) {
                      operator_delete(local_178._M_dataplus._M_p,
                                      CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                               local_178.field_2._M_local_buf[0]) + 1);
                    }
                    iVar18 = 1;
                  }
                  else if (pLVar5->isBackPropagable == false) {
                    pLVar14 = extraout_RAX;
                    if ((pLVar5->layerType != kSoftmax) ||
                       (pLVar14 = local_218,
                       local_218->lossLayerType != kCategoricalCrossEntropyLossLayer)) {
                      local_210 = (RepeatedPtrFieldBase *)
                                  CONCAT44(local_210._4_4_,
                                           (int)CONCAT71((int7)((ulong)pLVar14 >> 8),1));
                      std::__cxx11::string::_M_assign((string *)&local_288);
                      iVar18 = 0;
                    }
                  }
                  else {
                    iVar18 = 0;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != paVar1) {
                  operator_delete(local_150._M_dataplus._M_p,
                                  local_150.field_2._M_allocated_capacity + 1);
                }
                if ((iVar18 != 0xe) && (iVar18 != 0)) goto LAB_0029ab88;
                ppLVar20 = ppLVar20 + 1;
              } while (ppLVar20 != ppLVar4);
              iVar18 = 0xd;
            }
LAB_0029ab88:
            if (iVar18 == 0xd) {
              iVar18 = 0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        } while (iVar18 == 0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if (iVar18 != 0) goto LAB_0029ac4c;
        pNVar12 = nn->updateparams_;
        if (pNVar12 == (NetworkUpdateParameters *)0x0) {
          pNVar12 = (NetworkUpdateParameters *)
                    &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
        }
        iVar18 = local_154 + 1;
      } while (iVar18 < (pNVar12->losslayers_).super_RepeatedPtrFieldBase.current_size_);
      iVar18 = 8;
LAB_0029ac4c:
      if (iVar18 == 8) goto LAB_0029ac55;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_248);
  }
  else {
LAB_0029ac8c:
    local_2a8._M_p = local_2a0 + 8;
    local_2b0 = local_2d8;
    if (local_2d0._M_p == local_2c8 + 8) {
      local_2a0._16_8_ = local_2c8._16_8_;
    }
    else {
      local_2a8._M_p = local_2d0._M_p;
    }
    local_2a0._8_8_ = local_2c8._8_8_;
    local_2a0._0_8_ = local_2c8._0_8_;
    local_2c8._0_8_ = (pointer)0x0;
    local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffffffffff00;
    local_2d0._M_p = local_2c8 + 8;
  }
  std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::~vector(&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
  ::~_Rb_tree(&local_100);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
               *)local_130);
LAB_0029ad06:
  if (local_2d0._M_p != local_2c8 + 8) {
    operator_delete(local_2d0._M_p,local_2c8._8_8_ + 1);
  }
  __return_storage_ptr__->m_type = local_2b0._0_4_;
  __return_storage_ptr__->m_reason = local_2b0._4_4_;
  std::__cxx11::string::operator=(local_d0,(string *)&local_2a8);
  if (local_2a8._M_p != local_2a0 + 8) {
    operator_delete(local_2a8._M_p,local_2a0._8_8_ + 1);
  }
  CoreML::Result::good(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result validateUpdatableNeuralNetwork(const T& nn) {
    
    Result r;

    r = validateUpdatableLayerSupport(nn);
    if (!r.good()) {return r;}
    
    r = validateLayerAndLossLayerNamesCollisions(nn);
    if (!r.good()) {return r;}

    r = isTrainingConfigurationSupported(nn);
    if (!r.good()) {return r;}
    
    return r;
}